

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O3

LY_ERR schema_mount_sprinter_tree_node_override_parent_refs
                 (lysc_node *node,void *plugin_priv,ly_bool *skip,char **UNUSED_flags,
                 char **add_opts)

{
  long lVar1;
  lysc_module *plVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  lysc_node *plVar6;
  
  lVar1 = *(long *)((long)plugin_priv + 8);
  plVar2 = node->module->compiled;
  *skip = '\x01';
  uVar5 = (ulong)*(uint *)(lVar1 + 4);
  if (*(uint *)(lVar1 + 4) == 0) {
    return LY_SUCCESS;
  }
  bVar3 = false;
  uVar4 = 0;
LAB_0019fd34:
  do {
    if (bVar3) {
LAB_0019fd8b:
      if (node->parent != (lysc_node *)0x0) {
        return LY_SUCCESS;
      }
      *add_opts = "@";
      return LY_SUCCESS;
    }
    plVar6 = *(lysc_node **)(*(long *)(lVar1 + 8) + uVar4 * 8);
    if (plVar6 != (lysc_node *)0x0 && plVar6->module->compiled == plVar2) {
      do {
        if (plVar6 == node) {
          *skip = '\0';
          uVar5 = (ulong)*(uint *)(lVar1 + 4);
          uVar4 = uVar4 + 1;
          bVar3 = true;
          if (uVar4 < uVar5) goto LAB_0019fd34;
          goto LAB_0019fd8b;
        }
        plVar6 = plVar6->parent;
      } while (plVar6 != (lysc_node *)0x0);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 < uVar5);
  if (!bVar3) {
    return LY_SUCCESS;
  }
  goto LAB_0019fd8b;
}

Assistant:

static LY_ERR
schema_mount_sprinter_tree_node_override_parent_refs(const struct lysc_node *node, const void *plugin_priv,
        ly_bool *skip, const char **UNUSED(flags), const char **add_opts)
{
    uint32_t i;
    const struct ly_set *refs;
    const struct lysc_module *mod;
    struct lysc_node *ref, *iter;

    refs = ((struct sprinter_tree_priv *)plugin_priv)->refs;
    mod = node->module->compiled;

    /* Assume the @p node will be skipped. */
    *skip = 1;
    for (i = 0; (i < refs->count) && *skip; i++) {
        ref = refs->snodes[i];
        if (ref->module->compiled != mod) {
            /* parent-reference points to different module */
            continue;
        }

        for (iter = ref; iter; iter = iter->parent) {
            if (iter == node) {
                /* @p node is not skipped because it is parent-rererence node or his parent */
                *skip = 0;
                break;
            }
        }
    }

    if (!*skip && !node->parent) {
        /* top-node has additional opts */
        *add_opts = "@";
    }

    return LY_SUCCESS;
}